

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void calc_mean_and_sd_weighted<float,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  int *piVar1;
  size_t *psVar2;
  int iVar3;
  float fVar4;
  int iVar5;
  long lVar6;
  unsigned_long *key;
  int *piVar7;
  size_t row;
  long lVar8;
  size_t *key_00;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  double dVar12;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar13;
  longdouble local_bc;
  longdouble local_b0;
  longdouble local_a4;
  
  lVar8 = (long)Xc_indptr[col_num];
  lVar6 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  piVar1 = Xc_ind + lVar6;
  iVar3 = piVar1[-1];
  psVar2 = ix_arr + end + 1;
  key_00 = ix_arr + st;
  key = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                  (key_00,psVar2);
  lVar9 = (longdouble)0;
  for (; st <= end; st = st + 1) {
    pVar13 = tsl::detail_robin_hash::
             robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
             ::try_emplace<unsigned_long_const&>
                       ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                         *)w,key_00);
    lVar9 = lVar9 + (longdouble)*(double *)((pVar13.first.m_bucket.m_bucket)->m_value + 8);
    key_00 = key_00 + 1;
  }
  local_a4 = (longdouble)0;
  local_bc = local_a4;
  local_b0 = local_a4;
LAB_0026310e:
  piVar7 = Xc_ind + lVar8;
  lVar10 = in_ST0;
  do {
    if (((key == psVar2) || (lVar8 == lVar6)) || ((ulong)(long)iVar3 < *key)) {
LAB_002632c9:
      if ((local_bc != (longdouble)0) || (NAN(local_bc) || NAN((longdouble)0))) {
        if (local_bc < lVar9) {
          local_a4 = local_a4 + local_b0 * local_b0 * ((longdouble)1 - local_bc / lVar9) * local_bc;
          local_b0 = (local_bc / lVar9) * local_b0;
        }
        *x_mean = (double)local_b0;
        dVar12 = (double)SQRT(local_a4 / lVar9);
      }
      else {
        *x_mean = 0.0;
        dVar12 = 0.0;
      }
      *x_sd = dVar12;
      return;
    }
    iVar5 = (int)*key;
    if (*piVar7 == iVar5) {
      fVar4 = Xc[lVar8];
      pVar13 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::try_emplace<unsigned_long_const&>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,key);
      lVar11 = (longdouble)*(double *)((pVar13.first.m_bucket.m_bucket)->m_value + 8);
      if ((uint)ABS(fVar4) < 0x7f800000) {
        local_bc = local_bc + lVar11;
        local_a4 = in_ST1;
        in_ST1 = in_ST2;
        lVar11 = in_ST2;
        fmal();
        fmal();
        in_ST0 = in_ST2;
        in_ST2 = lVar11;
        local_b0 = lVar10;
      }
      else {
        lVar9 = lVar9 - lVar11;
        in_ST0 = lVar10;
      }
      if ((key == ix_arr + end) || (lVar8 == lVar6 + -1)) goto LAB_002632c9;
      key = key + 1;
      piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (piVar7 + 1,piVar1,key);
      lVar8 = (long)piVar7 - (long)Xc_ind >> 2;
      goto LAB_0026310e;
    }
    if (*piVar7 <= iVar5) break;
    key = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                    (key + 1,psVar2,piVar7);
  } while( true );
  piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (piVar7 + 1,piVar1,key);
  lVar8 = (long)piVar7 - (long)Xc_ind >> 2;
  in_ST0 = lVar10;
  goto LAB_0026310e;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}